

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_core.c
# Opt level: O1

_Bool fiber_status(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  gravity_object_t *pgVar1;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 aVar2;
  gravity_value_t value;
  
  pgVar1 = (args->field_1).p;
  if (pgVar1->htable == (gravity_hash_t *)0x0) {
    if (*(int *)&pgVar1->superclass == 0) {
      aVar2.n = 2;
    }
    else {
      aVar2.n._4_4_ = 0;
      aVar2.n._0_4_ = *(uint *)&pgVar1[1].gc.free;
    }
  }
  else {
    aVar2.n = 1;
  }
  value.field_1.n = aVar2.n;
  value.isa = gravity_class_int;
  gravity_vm_setslot(vm,value,rindex);
  return true;
}

Assistant:

static bool fiber_status (gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
    #pragma unused(nargs)
    
    // status codes:
    // 0    never executed
    // 1    aborted with error
    // 2    terminated
    // 3    running
    // 4    trying
    
    gravity_fiber_t *fiber = VALUE_AS_FIBER(GET_VALUE(0));
    if (fiber->error) RETURN_VALUE(VALUE_FROM_INT(FIBER_ABORTED_WITH_ERROR), rindex);
    if (fiber->nframes == 0) RETURN_VALUE(VALUE_FROM_INT(FIBER_TERMINATED), rindex);
    RETURN_VALUE(VALUE_FROM_INT(fiber->status), rindex);
}